

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O3

bool __thiscall
absl::numbers_internal::safe_strtou64_base
          (numbers_internal *this,string_view text,Nonnull<uint64_t_*> value,int base)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  byte *pbVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  byte *pbVar11;
  byte *pbVar12;
  ulong uVar13;
  
  uVar5 = (uint)value;
  pbVar11 = (byte *)text._M_len;
  *(ulong *)text._M_str = 0;
  if (pbVar11 != (byte *)0x0) {
    pbVar12 = pbVar11;
    if (0 < (long)this) {
      do {
        if (((&ascii_internal::kPropertyBits)[*pbVar12] & 8) == 0) break;
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 < pbVar11 + (long)this);
    }
    do {
      if (pbVar11 + (long)this <= pbVar12) {
        return false;
      }
      pbVar7 = pbVar11 + -1 + (long)this;
      this = this + -1;
    } while (((&ascii_internal::kPropertyBits)[*pbVar7] & 8) != 0);
    bVar1 = *pbVar12;
    pbVar7 = pbVar11 + (long)this + 1;
    if (((bVar1 != 0x2d) && (bVar1 != 0x2b)) || (pbVar12 = pbVar12 + 1, pbVar12 < pbVar7)) {
      if (uVar5 == 0x10) {
        pbVar10 = pbVar11 + (long)this + 1;
        uVar5 = 0x10;
        if (((1 < (long)(pbVar11 + (long)this + (1 - (long)pbVar12))) && (*pbVar12 == 0x30)) &&
           (((pbVar12[1] | 0x20) == 0x78 && (pbVar12 = pbVar12 + 2, pbVar7 <= pbVar12)))) {
          return false;
        }
      }
      else if (uVar5 == 0) {
        pbVar10 = pbVar11 + (long)this + 1;
        if (((long)(pbVar11 + (long)this) - (long)pbVar12) + 1 < 2) {
          uVar5 = 10;
          if ((long)(pbVar11 + (long)this) - (long)pbVar12 == 0) {
            bVar2 = *pbVar12;
            pbVar12 = pbVar12 + (bVar2 == 0x30);
            uVar5 = (uint)(bVar2 != 0x30) * 2 + 8;
          }
        }
        else if (*pbVar12 == 0x30) {
          if ((pbVar12[1] | 0x20) == 0x78) {
            pbVar12 = pbVar12 + 2;
            if (pbVar7 <= pbVar12) {
              return false;
            }
            uVar5 = 0x10;
          }
          else {
            pbVar12 = pbVar12 + 1;
            uVar5 = 8;
          }
        }
        else {
          uVar5 = 10;
        }
      }
      else {
        pbVar10 = pbVar7;
        if (0x22 < uVar5 - 2) {
          return false;
        }
      }
      if (bVar1 != 0x2d) {
        uVar6 = CONCAT44(0,uVar5);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar6;
        if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar3,0) !=
            *(ulong *)((anonymous_namespace)::LookupTables<unsigned_long>::kVmaxOverBase + uVar6 * 8
                      )) {
          __assert_fail("base < 2 || std::numeric_limits<IntType>::max() / base_inttype == vmax_over_base"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                        ,0x3df,
                        "bool absl::(anonymous namespace)::safe_parse_positive_int(absl::string_view, int, absl::Nonnull<IntType *>) [IntType = unsigned long]"
                       );
        }
        bVar4 = true;
        if ((long)pbVar10 - (long)pbVar12 < 1) {
          uVar9 = 0;
        }
        else {
          pbVar11 = pbVar12 + ((long)pbVar10 - (long)pbVar12);
          uVar9 = 0;
          do {
            uVar13 = (ulong)(char)(anonymous_namespace)::kAsciiToInt[*pbVar12];
            if (uVar6 <= uVar13) {
              bVar4 = false;
              break;
            }
            if ((*(ulong *)((anonymous_namespace)::LookupTables<unsigned_long>::kVmaxOverBase +
                           uVar6 * 8) < uVar9) ||
               (uVar8 = uVar9 * uVar6, uVar9 = uVar8 + uVar13, CARRY8(uVar8,uVar13))) {
              bVar4 = false;
              uVar9 = 0xffffffffffffffff;
              break;
            }
            pbVar12 = pbVar12 + 1;
          } while (pbVar12 < pbVar11);
        }
        *(ulong *)text._M_str = uVar9;
        return bVar4;
      }
    }
  }
  return false;
}

Assistant:

bool safe_strtou64_base(absl::string_view text, absl::Nonnull<uint64_t*> value,
                        int base) {
  return safe_uint_internal<uint64_t>(text, value, base);
}